

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generators.cpp
# Opt level: O0

string * __thiscall
flatbuffers::BaseGenerator::GeneratedFileName
          (string *__return_storage_ptr__,BaseGenerator *this,string *path,string *file_name,
          IDLOptions *options)

{
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  IDLOptions *local_30;
  IDLOptions *options_local;
  string *file_name_local;
  string *path_local;
  BaseGenerator *this_local;
  
  local_30 = options;
  options_local = (IDLOptions *)file_name;
  file_name_local = path;
  path_local = (string *)this;
  this_local = (BaseGenerator *)__return_storage_ptr__;
  std::operator+(&local_90,path,file_name);
  std::operator+(&local_70,&local_90,&local_30->filename_suffix);
  std::operator+(&local_50,&local_70,".");
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    local_c8 = &local_30->filename_extension;
  }
  else {
    local_c8 = &this->default_extension_;
  }
  std::operator+(__return_storage_ptr__,&local_50,local_c8);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  return __return_storage_ptr__;
}

Assistant:

std::string BaseGenerator::GeneratedFileName(const std::string &path,
                                             const std::string &file_name,
                                             const IDLOptions &options) const {
  return path + file_name + options.filename_suffix + "." +
         (options.filename_extension.empty() ? default_extension_
                                             : options.filename_extension);
}